

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void nni_thr_wrap(void *arg)

{
  int iVar1;
  bool bVar2;
  int start;
  nni_thr *thr;
  void *arg_local;
  
  nni_plat_mtx_lock((nni_plat_mtx *)((long)arg + 0x18));
  while( true ) {
    iVar1 = *(int *)((long)arg + 0x88);
    bVar2 = false;
    if (iVar1 == 0) {
      bVar2 = *(int *)((long)arg + 0x8c) == 0;
    }
    if (!bVar2) break;
    nni_plat_cv_wait((nni_plat_cv *)((long)arg + 0x40));
  }
  nni_plat_mtx_unlock((nni_plat_mtx *)((long)arg + 0x18));
  if ((iVar1 != 0) && (*(long *)((long)arg + 0x78) != 0)) {
    (**(code **)((long)arg + 0x78))(*(undefined8 *)((long)arg + 0x80));
  }
  nni_plat_mtx_lock((nni_plat_mtx *)((long)arg + 0x18));
  *(undefined4 *)((long)arg + 0x90) = 1;
  nni_plat_cv_wake((nni_plat_cv *)((long)arg + 0x40));
  nni_plat_mtx_unlock((nni_plat_mtx *)((long)arg + 0x18));
  return;
}

Assistant:

static void
nni_thr_wrap(void *arg)
{
	nni_thr *thr = arg;
	int      start;

	nni_plat_mtx_lock(&thr->mtx);
	while (((start = thr->start) == 0) && (thr->stop == 0)) {
		nni_plat_cv_wait(&thr->cv);
	}
	nni_plat_mtx_unlock(&thr->mtx);
	if ((start) && (thr->fn != NULL)) {
		thr->fn(thr->arg);
	}
	nni_plat_mtx_lock(&thr->mtx);
	thr->done = 1;
	nni_plat_cv_wake(&thr->cv);
	nni_plat_mtx_unlock(&thr->mtx);
}